

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

Variable * __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareVarying
          (VaryingComponentsTest *this,Type *basic_type,descriptor *desc,GLchar *interpolation,
          ShaderInterface *si,STAGES stage,STORAGE storage)

{
  GLint GVar1;
  GLint GVar2;
  Type *pTVar3;
  uint uVar4;
  GLuint GVar5;
  ShaderInterface *this_00;
  GLchar *pGVar6;
  GLchar *pGVar7;
  reference pvVar8;
  Type TVar9;
  Variable *local_e8;
  Variable *var;
  GLuint local_d8;
  Variable *local_cc;
  GLuint local_c4;
  Type *local_c0;
  Type *type;
  GLuint size;
  string local_a8;
  string *local_88;
  string *qual;
  undefined1 local_78 [4];
  GLuint offset;
  string *local_58;
  string *name;
  GLuint local_48;
  GLuint component_size;
  GLuint array_length;
  STAGES stage_local;
  ShaderInterface *si_local;
  GLchar *interpolation_local;
  descriptor *desc_local;
  Type *basic_type_local;
  VaryingComponentsTest *this_local;
  
  component_size = stage;
  _array_length = si;
  si_local = (ShaderInterface *)interpolation;
  interpolation_local = (GLchar *)desc;
  desc_local = (descriptor *)basic_type;
  basic_type_local = (Type *)this;
  local_48 = (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.
                                super_TestBase.super_TestCase.super_TestCase.super_TestNode.
                                _vptr_TestNode + 0x110))();
  name._4_4_ = Utils::Type::GetSize((Type *)desc_local);
  prepareName_abi_cxx11_
            ((string *)local_78,this,*(GLchar **)(interpolation_local + 0x28),
             *(GLint *)(interpolation_local + 0x10),*(GLint *)interpolation_local,component_size,
             storage);
  qual._4_4_ = *(int *)interpolation_local * name._4_4_;
  local_58 = (string *)local_78;
  prepareQualifiers_abi_cxx11_
            (&local_a8,this,*(GLchar **)(interpolation_local + 0x18),
             *(GLchar **)(interpolation_local + 8),(GLchar *)si_local);
  local_88 = &local_a8;
  type._0_4_ = *(int *)(interpolation_local + 0x20) * name._4_4_;
  TVar9 = Utils::Type::GetType(desc_local->m_component,1,*(GLuint *)(interpolation_local + 0x20));
  this_00 = _array_length;
  var = TVar9._0_8_;
  local_cc = var;
  local_d8 = TVar9.m_n_rows;
  local_c4 = local_d8;
  local_c0 = (Type *)&local_cc;
  if (storage == VARYING_INPUT) {
    pGVar6 = (GLchar *)std::__cxx11::string::c_str();
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    GVar5 = local_48;
    uVar4 = qual._4_4_;
    pTVar3 = local_c0;
    GVar1 = *(GLint *)interpolation_local;
    GVar2 = *(GLint *)(interpolation_local + 0x10);
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_data,(ulong)qual._4_4_);
    local_e8 = Utils::ShaderInterface::Input<void>
                         (this_00,pGVar6,pGVar7,GVar1,GVar2,pTVar3,'\0',GVar5,0,uVar4,pvVar8,
                          (ulong)(uint)type);
  }
  else {
    pGVar6 = (GLchar *)std::__cxx11::string::c_str();
    pGVar7 = (GLchar *)std::__cxx11::string::c_str();
    GVar5 = local_48;
    uVar4 = qual._4_4_;
    pTVar3 = local_c0;
    GVar1 = *(GLint *)interpolation_local;
    GVar2 = *(GLint *)(interpolation_local + 0x10);
    pvVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->m_data,(ulong)qual._4_4_);
    local_e8 = Utils::ShaderInterface::Output<void>
                         (this_00,pGVar6,pGVar7,GVar1,GVar2,pTVar3,'\0',GVar5,0,uVar4,pvVar8,
                          (ulong)(uint)type);
  }
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)local_78);
  return local_e8;
}

Assistant:

Utils::Variable* VaryingComponentsTest::prepareVarying(const Utils::Type& basic_type, const descriptor& desc,
													   const GLchar* interpolation, Utils::ShaderInterface& si,
													   Utils::Shader::STAGES stage, Utils::Variable::STORAGE storage)
{
	const GLuint	   array_length   = getArrayLength();
	const GLuint	   component_size = basic_type.GetSize();
	const std::string& name			  = prepareName(desc.m_name, desc.m_location, desc.m_component, stage, storage);
	const GLuint	   offset		  = desc.m_component * component_size;
	const std::string& qual			  = prepareQualifiers(desc.m_location_str, desc.m_component_str, interpolation);
	const GLuint	   size			  = desc.m_n_rows * component_size;
	const Utils::Type& type			  = Utils::Type::GetType(basic_type.m_basic_type, 1 /* n_columns */, desc.m_n_rows);
	Utils::Variable*   var			  = 0;

	if (Utils::Variable::VARYING_INPUT == storage)
	{
		var = si.Input(name.c_str(), qual.c_str() /* qualifiers */, desc.m_component /* expected_componenet */,
					   desc.m_location /* expected_location */, type, /* built_in_type */
					   GL_FALSE /* normalized */, array_length /* n_array_elements */, 0u /* stride */,
					   offset /* offset */, (GLvoid*)&m_data[offset] /* data */, size /* data_size */);
	}
	else
	{
		var = si.Output(name.c_str(), qual.c_str() /* qualifiers */, desc.m_component /* expected_componenet */,
						desc.m_location /* expected_location */, type, /* built_in_type */
						GL_FALSE /* normalized */, array_length /* n_array_elements */, 0u /* stride */,
						offset /* offset */, (GLvoid*)&m_data[offset] /* data */, size /* data_size */);
	}

	return var;
}